

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aipc.c
# Opt level: O0

void nn_aipc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_aipc *aipc;
  nn_fsm_owner *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  long local_28;
  
  local_28 = in_RDI;
  if (in_RDI == 0) {
    local_28 = 0;
  }
  if (in_ESI == 0xfffffffe && in_EDX == 0xfffffffd) {
    iVar1 = nn_sipc_isidle((nn_sipc *)0x2008c8);
    if (iVar1 == 0) {
      nn_ep_stat_increment
                ((nn_ep *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8);
      nn_sipc_stop((nn_sipc *)0x2008f6);
    }
    *(undefined4 *)(local_28 + 0x58) = 7;
  }
  if (*(int *)(local_28 + 0x58) == 7) {
    iVar1 = nn_sipc_isidle((nn_sipc *)0x20092c);
    if (iVar1 == 0) {
      return;
    }
    nn_usock_stop((nn_usock *)0x200944);
    *(undefined4 *)(local_28 + 0x58) = 8;
  }
  if (*(int *)(local_28 + 0x58) == 8) {
    iVar1 = nn_usock_isidle((nn_usock *)0x20097b);
    if (iVar1 != 0) {
      if (*(long *)(local_28 + 0x2c8) != 0) {
        if (*(long *)(local_28 + 0x2d8) == 0) {
          nn_backtrace_print();
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","aipc->listener_owner.fsm",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/aipc.c"
                  ,0x88);
          fflush(_stderr);
          nn_err_abort();
        }
        nn_usock_swap_owner((nn_usock *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
        *(undefined8 *)(local_28 + 0x2c8) = 0;
        *(undefined4 *)(local_28 + 0x2d0) = 0xffffffff;
        *(undefined8 *)(local_28 + 0x2d8) = 0;
      }
      *(undefined4 *)(local_28 + 0x58) = 1;
      nn_fsm_stopped((nn_fsm *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    }
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
          (ulong)*(uint *)(local_28 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/aipc.c"
          ,0x93);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_aipc_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_aipc *aipc;

    aipc = nn_cont (self, struct nn_aipc, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (!nn_sipc_isidle (&aipc->sipc)) {
            nn_ep_stat_increment (aipc->ep, NN_STAT_DROPPED_CONNECTIONS, 1);
            nn_sipc_stop (&aipc->sipc);
        }
        aipc->state = NN_AIPC_STATE_STOPPING_SIPC_FINAL;
    }
    if (nn_slow (aipc->state == NN_AIPC_STATE_STOPPING_SIPC_FINAL)) {
        if (!nn_sipc_isidle (&aipc->sipc))
            return;
        nn_usock_stop (&aipc->usock);
        aipc->state = NN_AIPC_STATE_STOPPING;
    }
    if (nn_slow (aipc->state == NN_AIPC_STATE_STOPPING)) {
        if (!nn_usock_isidle (&aipc->usock))
            return;
       if (aipc->listener) {
            nn_assert (aipc->listener_owner.fsm);
            nn_usock_swap_owner (aipc->listener, &aipc->listener_owner);
            aipc->listener = NULL;
            aipc->listener_owner.src = -1;
            aipc->listener_owner.fsm = NULL;
        }
        aipc->state = NN_AIPC_STATE_IDLE;
        nn_fsm_stopped (&aipc->fsm, NN_AIPC_STOPPED);
        return;
    }

    nn_fsm_bad_state(aipc->state, src, type);
}